

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  uint uVar1;
  int *piVar2;
  double *pdVar3;
  shared_count sVar4;
  int iVar5;
  void *pvVar6;
  double *p;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  shared_count sStack_50;
  double *local_48;
  shared_count asStack_40 [2];
  
  uVar1 = this->nMatrixDimension;
  lVar13 = (long)(int)uVar1;
  uVar16 = lVar13 * 4;
  if (lVar13 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar16);
  iVar15 = this->nData;
  lVar12 = (long)iVar15;
  uVar14 = lVar12 * 8;
  if (lVar12 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  p = (double *)operator_new__(uVar14);
  piVar7 = (int *)operator_new__(uVar16);
  if (0 < lVar13) {
    piVar8 = this->pSize + lVar13;
    lVar10 = 0;
    do {
      piVar8 = piVar8 + -1;
      piVar7[lVar10] = *piVar8;
      lVar10 = lVar10 + 1;
    } while (lVar13 != lVar10);
  }
  piVar8 = (int *)operator_new__(uVar16);
  if (uVar1 != 0) {
    iVar5 = 1;
    lVar10 = lVar13;
    do {
      piVar8[lVar10 + -1] = iVar5;
      iVar5 = iVar5 * piVar7[lVar10 + -1];
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  piVar2 = this->pMult;
  if (0 < iVar15) {
    pdVar3 = this->pData;
    lVar10 = 0;
    do {
      if ((int)uVar1 < 1) {
LAB_00136d76:
        lVar9 = 0;
      }
      else {
        uVar16 = 0;
        lVar9 = lVar10;
        do {
          iVar15 = (int)lVar9;
          lVar9 = (long)iVar15 % (long)piVar2[uVar16];
          *(int *)((long)pvVar6 + uVar16 * 4) = iVar15 / piVar2[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
        if ((int)uVar1 < 1) goto LAB_00136d76;
        uVar16 = 0;
        iVar15 = 0;
        piVar11 = (int *)((long)pvVar6 + lVar13 * 4);
        do {
          piVar11 = piVar11 + -1;
          iVar15 = iVar15 + piVar8[uVar16] * *piVar11;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
        lVar9 = (long)iVar15;
      }
      p[lVar9] = pdVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar12);
  }
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  this->pMult = piVar8;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  this->pSize = piVar7;
  this->pData = p;
  boost::detail::shared_count::shared_count<double*,MatrixDataDeleter>
            (&sStack_50,p,(MatrixDataDeleter)SUB41(*(undefined4 *)&this->bReference,0));
  sVar4.pi_ = sStack_50.pi_;
  sStack_50.pi_ = (sp_counted_base *)0x0;
  local_48 = (this->matrixParent).px;
  asStack_40[0].pi_ = (this->matrixParent).pn.pi_;
  (this->matrixParent).px = p;
  (this->matrixParent).pn.pi_ = sVar4.pi_;
  boost::detail::shared_count::~shared_count(asStack_40);
  boost::detail::shared_count::~shared_count(&sStack_50);
  return this;
}

Assistant:

Matrix &Matrix::transpose()
{
	int *indexes = new int[nMatrixDimension]; // array with indexes
	double *newData = new double[nData]; // array for re-arranged values
	
	// array with new shape
	int *newSize = new int[nMatrixDimension]; 
	for( int i=0; i<nMatrixDimension; i++ )
		newSize[i] = pSize[nMatrixDimension- i-1];
	
	// array with new multipliers
	int *newMult = new int[nMatrixDimension];
	int m = 1;
	for(int i=nMatrixDimension-1; i+1; i--) {
		newMult[i] = m;
		m *= newSize[i];
	}
	
	for( int i=0; i<nData; i++ ) {
		// find index of data i
		int remainder = i;
		for( int j=0; j<nMatrixDimension; j++) {
			indexes[j] = remainder / pMult[j];
			remainder -= indexes[j] * pMult[j]; // modulo :-)
		}
		// find new offset by re-interpreting index
		int newOffset = 0;
		for( int j=0; j<nMatrixDimension; j++)
			newOffset += indexes[nMatrixDimension-j-1] * newMult[j];
		// write into new position
		newData[ newOffset ] = pData[i];
	}	
	
	// save new data
	delete[] pMult;
	pMult = newMult;
	delete[] pSize;
	pSize = newSize;
	pData = newData;
	matrixParent = shared_array<double>(newData, MatrixDataDeleter(this));
	
	// bye.
	return *this;
}